

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::RefreshLineSet(EmmyDebuggerManager *this)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_38 [8];
  shared_ptr<BreakPoint> bp;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_> *__range1;
  EmmyDebuggerManager *this_local;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&this->lineSet);
  __end1 = std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
           begin(&this->breakpoints);
  bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::end
                 (&this->breakpoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
                                *)&bp.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<BreakPoint>::shared_ptr((shared_ptr<BreakPoint> *)local_38,psVar2);
    peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_38);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&this->lineSet,&peVar3->line);
    std::shared_ptr<BreakPoint>::~shared_ptr((shared_ptr<BreakPoint> *)local_38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void EmmyDebuggerManager::RefreshLineSet()
{
	lineSet.clear();
	for (auto bp : breakpoints)
	{
		lineSet.insert(bp->line);
	}
}